

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM1IPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  GLint GVar9;
  GLFWwindow *handle;
  ostream *poVar10;
  int _height;
  int _width;
  char *pcVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_14a;
  allocator local_149;
  double local_148;
  GLFWwindow *local_140;
  char **local_138;
  double local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fragment_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tess_evaluation_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tess_control_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vertex_shader_paths;
  int width_window;
  int height_window;
  string local_70;
  string local_50;
  string *paths;
  
  vertex_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertex_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tess_control_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tess_control_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tess_control_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tess_evaluation_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tess_evaluation_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tess_evaluation_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fragment_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fragment_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fragment_shader_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = argv;
  iVar7 = glfwInit();
  if (iVar7 == 0) {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Could not initialize glfw");
    std::endl<char,std::char_traits<char>>(poVar10);
    iVar7 = 1;
  }
  else {
    glfwSetErrorCallback(main::anon_class_1_0_00000001::__invoke);
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,0);
    glfwWindowHint(0x22008,0x32001);
    iVar7 = 1;
    glfwWindowHint(0x22006,1);
    _height = 0;
    handle = glfwCreateWindow(width,height,"shader-pipeline",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      pcVar11 = "Could not create glfw window";
    }
    else {
      std::operator<<((ostream *)&std::cout,
                      "\nUsage:\n  [Click and drag]  to orbit view\n  [Scroll]  to translate view in and out\n  A,a  toggle animation\n  L,l  toggle wireframe rending\n  Z,z  reset view to look along z-axis\n"
                     );
      glfwSetWindowPos(handle,0,0);
      glfwMakeContextCurrent(handle);
      iVar8 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar8 != 0) {
        print_opengl_info(handle);
        std::__cxx11::string::string((string *)&local_50,"init",(allocator *)&width_window);
        igl::opengl::report_gl_error(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        icosahedron<Eigen::Matrix<float,_1,3,1,_1,3>,Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
                  (&V.super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>,
                   &F.super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>);
        mesh_to_vao(&V,&F,&VAO);
        std::__cxx11::string::string((string *)&local_70,"mesh_to_vao",(allocator *)&width_window);
        igl::opengl::report_gl_error(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        glfwSetWindowSizeCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwGetWindowSize(handle,&width_window,&height_window);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((ulong)_width_window & 0xffffffff),
                   (GLFWwindow *)(ulong)(uint)height_window,_width,_height);
        glfwSetKeyCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetCharModsCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetMouseButtonCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetCursorPosCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetScrollCallback(handle,main::anon_class_1_0_00000001::__invoke);
        (*glad_glEnable)(0xb71);
        (*glad_glEnable)(0xb44);
        local_140 = handle;
        get_seconds();
        local_130 = 0.0;
        local_148 = 0.0;
        while( true ) {
          iVar7 = glfwWindowShouldClose(local_140);
          if (iVar7 != 0) break;
          dVar1 = get_seconds();
          std::__cxx11::string::string((string *)&width_window,local_138[1],&local_149);
          __l._M_len = 1;
          __l._M_array = (string *)&width_window;
          paths = (string *)&width_window;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&height_window,__l,&local_14a);
          bVar6 = main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&height_window,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)paths,local_130);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&height_window);
          std::__cxx11::string::~string((string *)&width_window);
          if (bVar6) {
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "-----------------------------------------------");
            std::endl<char,std::char_traits<char>>(poVar10);
            local_130 = get_seconds();
            std::__cxx11::string::string
                      ((string *)&width_window,local_138[1],(allocator *)&height_window);
            paths = (string *)&vertex_shader_paths;
            bVar6 = read_json((string *)&width_window,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)paths,&tess_control_shader_paths,&tess_evaluation_shader_paths,
                              &fragment_shader_paths);
            std::__cxx11::string::~string((string *)&width_window);
            local_148 = 0.0;
            if (!bVar6) {
              poVar10 = std::operator<<((ostream *)&std::cerr,"Failed to read ");
              paths = (string *)local_138[1];
              poVar10 = std::operator<<(poVar10,(char *)paths);
              std::endl<char,std::char_traits<char>>(poVar10);
            }
          }
          bVar6 = main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&vertex_shader_paths,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)paths,local_148);
          if (bVar6) {
LAB_0012ce27:
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "-----------------------------------------------");
            std::endl<char,std::char_traits<char>>(poVar10);
            local_148 = get_seconds();
            bVar6 = create_shader_program_from_files
                              (&vertex_shader_paths,&tess_control_shader_paths,
                               &tess_evaluation_shader_paths,&fragment_shader_paths,&prog_id);
            if (!bVar6) {
              (*glad_glDeleteProgram)(prog_id);
              prog_id = 0;
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "-----------------------------------------------");
              std::endl<char,std::char_traits<char>>(poVar10);
            }
          }
          else {
            bVar6 = main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)&tess_control_shader_paths,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)paths,local_148);
            if (bVar6) goto LAB_0012ce27;
            bVar6 = main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)&tess_evaluation_shader_paths,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)paths,local_148);
            if (bVar6) goto LAB_0012ce27;
            bVar6 = main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)&fragment_shader_paths,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)paths,local_148);
            if (bVar6) goto LAB_0012ce27;
          }
          (*glad_glClearColor)(0.0,0.0,0.0,0.0);
          (*glad_glClear)(0x4100);
          glfwGetFramebufferSize(local_140,&width,&height);
          (*glad_glViewport)(0,0,width,height);
          (*glad_glUseProgram)(prog_id);
          if (is_animating == true) {
            dVar2 = get_seconds();
            animation_seconds = (dVar2 - last_time) + animation_seconds;
            last_time = dVar2;
          }
          p_Var3 = glad_glUniform1f;
          GVar9 = (*glad_glGetUniformLocation)(prog_id,"animation_seconds");
          (*p_Var3)(GVar9,(float)animation_seconds);
          p_Var5 = glad_glUniformMatrix4fv;
          GVar9 = (*glad_glGetUniformLocation)(prog_id,"proj");
          (*p_Var5)(GVar9,1,'\0',(GLfloat *)&proj);
          p_Var5 = glad_glUniformMatrix4fv;
          GVar9 = (*glad_glGetUniformLocation)(prog_id,"view");
          (*p_Var5)(GVar9,1,'\0',(GLfloat *)&view);
          (*glad_glPolygonMode)(0x408,0x1b02 - wire_frame);
          iVar7 = 2;
          while( true ) {
            p_Var4 = glad_glUniform1i;
            if (iVar7 == 0) break;
            GVar9 = (*glad_glGetUniformLocation)(prog_id,"is_moon");
            (*p_Var4)(GVar9,SUB14(iVar7 == 1,0));
            (*glad_glBindVertexArray)(VAO);
            (*glad_glDrawElements)
                      (0xe,(int)F.
                                super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>
                                .m_storage.m_rows * 3,0x1405,(void *)0x0);
            (*glad_glBindVertexArray)(0);
            iVar7 = iVar7 + -1;
          }
          glfwSwapBuffers(local_140);
          glfwPollEvents();
          dVar2 = get_seconds();
          dVar1 = (dVar2 - dVar1) * 1000000.0;
          if (dVar1 < 16666.666666666668) {
            _width_window = (pointer)(long)(int)(16666.666666666668 - dVar1);
            std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                      ((duration<long,_std::ratio<1L,_1000000L>_> *)&width_window);
          }
        }
        glfwDestroyWindow(local_140);
        iVar7 = 0;
        glfwTerminate();
        goto LAB_0012d10f;
      }
      pcVar11 = "Failed to load OpenGL and its extensions";
    }
    poVar10 = std::operator<<((ostream *)&std::cerr,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
LAB_0012d10f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fragment_shader_paths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tess_evaluation_shader_paths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tess_control_shader_paths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vertex_shader_paths);
  return iVar7;
}

Assistant:

int main(int argc, char * argv[])
{

  std::vector<std::string> vertex_shader_paths;
  std::vector<std::string> tess_control_shader_paths;
  std::vector<std::string> tess_evaluation_shader_paths;
  std::vector<std::string> fragment_shader_paths;

  // Initialize glfw window
  if(!glfwInit())
  {
    std::cerr<<"Could not initialize glfw"<<std::endl;
     return EXIT_FAILURE;
  }
  const auto & error = [] (int error, const char* description)
  {
    std::cerr<<description<<std::endl;
  };
  glfwSetErrorCallback(error);
  glfwWindowHint(GLFW_SAMPLES, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
  glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
  GLFWwindow* window = glfwCreateWindow(width, height, "shader-pipeline", NULL, NULL);
  if(!window)
  {
    glfwTerminate();
    std::cerr<<"Could not create glfw window"<<std::endl;
    return EXIT_FAILURE;
  }
  std::cout<<R"(
Usage:
  [Click and drag]  to orbit view
  [Scroll]  to translate view in and out
  A,a  toggle animation
  L,l  toggle wireframe rending
  Z,z  reset view to look along z-axis
)";
  glfwSetWindowPos(window,0,0);
  glfwMakeContextCurrent(window);
  // Load OpenGL and its extensions
  if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
  {
    std::cerr<<"Failed to load OpenGL and its extensions"<<std::endl;
    return EXIT_FAILURE;
  }
  print_opengl_info(window);
  igl::opengl::report_gl_error("init");


  icosahedron(V,F);
  mesh_to_vao(V,F,VAO);
  igl::opengl::report_gl_error("mesh_to_vao");

  const auto & reshape = [](
    GLFWwindow* window,
    int _width,
    int _height)
  {
    ::width=_width,::height=_height;

    // augh, windows can't handle variables named near and far.
    float nearVal = 0.01;
    float farVal = 100;
    float top = tan(35./360.*M_PI)*nearVal;
    float right = top * (double)::width/(double)::height;
    float left = -right;
    float bottom = -top;
    proj.setConstant(4,4,0.);
    proj(0,0) = (2.0 * nearVal) / (right - left);
    proj(1,1) = (2.0 * nearVal) / (top - bottom);
    proj(0,2) = (right + left) / (right - left);
    proj(1,2) = (top + bottom) / (top - bottom);
    proj(2,2) = -(farVal + nearVal) / (farVal - nearVal);
    proj(3,2) = -1.0;
    proj(2,3) = -(2.0 * farVal * nearVal) / (farVal - nearVal);
  };
  // Set up window resizing
  glfwSetWindowSizeCallback(window,reshape);
  {
    int width_window, height_window;
    glfwGetWindowSize(window, &width_window, &height_window);
    reshape(window,width_window,height_window);
  }

  // Close the window if user presses ESC or CTRL+C
  glfwSetKeyCallback(
    window,
    [](GLFWwindow* window, int key, int scancode, int action, int mods)
    {
      if(key == 256 || (key == 67 && (mods & GLFW_MOD_CONTROL)))
      {
        glfwSetWindowShouldClose(window,true);
      }
    });
  glfwSetCharModsCallback(
    window,
    [](GLFWwindow* window, unsigned int codepoint, int modifier)
    {
      switch(codepoint)
      {
        case 'A':
        case 'a':
          is_animating ^= 1;
          if(is_animating)
          {
            last_time = get_seconds();
          }
          break;
        case 'L':
        case 'l':
          wire_frame ^= 1;
          if (wire_frame) {
            glDisable(GL_CULL_FACE);
          } else {
            glEnable(GL_CULL_FACE);
          }
          break;
        case 'Z':
        case 'z':
          view.matrix().block(0,0,3,3).setIdentity();
          break;
        default:
          std::cout<<"Unrecognized key: "<<(unsigned char) codepoint<<std::endl;
          break;
      }
    });
  glfwSetMouseButtonCallback(
    window,
    [](GLFWwindow * window, int button, int action, int mods)
    {
      mouse_down = action == GLFW_PRESS;
    });
  glfwSetCursorPosCallback(
    window,
    [](GLFWwindow * window, double x, double y)
    {
      static double mouse_last_x = x;
      static double mouse_last_y = y;
      double dx = x-mouse_last_x;
      double dy = y-mouse_last_y;
      if(mouse_down)
      {
        // Two axis valuator with fixed up
        float factor = std::abs(view.matrix()(2,3));
        view.rotate(
          Eigen::AngleAxisf(
            dx*factor/float(width),
            Eigen::Vector3f(0,1,0)));
        view.rotate(
          Eigen::AngleAxisf(
            dy*factor/float(height),
            view.matrix().topLeftCorner(3,3).inverse()*Eigen::Vector3f(1,0,0)));
      }
      mouse_last_x = x;
      mouse_last_y = y;
    });
  glfwSetScrollCallback(window,
    [](GLFWwindow * window, double xoffset, double yoffset)
    {
      view.matrix()(2,3) =
        std::min(std::max(view.matrix()(2,3)+(float)yoffset,-100.0f),-2.0f);
    });

  glEnable(GL_DEPTH_TEST);
  glEnable(GL_CULL_FACE);
  // Force compilation on first iteration through loop
  double time_of_last_shader_compilation = 0;
  double time_of_last_json_load = 0;
  const auto any_changed = 
    [](
        const std::vector<std::string> &paths,
        const double time_of_last_shader_compilation
        )->bool
  {
    for(const auto & path : paths)
    {
      if(last_modification_time(path) > time_of_last_shader_compilation)
      {
        std::cout<<path<<" has changed since last compilation attempt."<<std::endl;
        return true;
      }
    }
    return false;
  };

  float start_time = get_seconds();
  // Main display routine
  while (!glfwWindowShouldClose(window))
  {
    double tic = get_seconds();

    if(any_changed({argv[1]},time_of_last_json_load))
    {
      std::cout<<"-----------------------------------------------"<<std::endl;
      time_of_last_json_load = get_seconds();
      if(!read_json(argv[1],
            vertex_shader_paths,
            tess_control_shader_paths,
            tess_evaluation_shader_paths,
            fragment_shader_paths))
      {
        std::cerr<<"Failed to read "<<argv[1]<<std::endl;
      }
#ifdef USE_SOLUTION
      {
        const auto replace_all = [](std::vector<std::string> & paths)
        {
          for(auto & path : paths)
          {
            find_and_replace_all("/src/","/solution/",path);
          }
        };
        replace_all(vertex_shader_paths);
        replace_all(tess_control_shader_paths);
        replace_all(tess_evaluation_shader_paths);
        replace_all(fragment_shader_paths);
      }
#endif
      // force reload of shaders
      time_of_last_shader_compilation = 0;
    }
    if(
      any_changed(vertex_shader_paths         ,time_of_last_shader_compilation) ||
      any_changed(tess_control_shader_paths   ,time_of_last_shader_compilation) ||
      any_changed(tess_evaluation_shader_paths,time_of_last_shader_compilation) ||
      any_changed(fragment_shader_paths       ,time_of_last_shader_compilation))
    {
      std::cout<<"-----------------------------------------------"<<std::endl;
      // remember the time we tried to compile
      time_of_last_shader_compilation = get_seconds();
      if(
          !create_shader_program_from_files(
            vertex_shader_paths,
            tess_control_shader_paths,
            tess_evaluation_shader_paths,
            fragment_shader_paths,
            prog_id))
      {
        // Force null shader to visually indicate failure
        glDeleteProgram(prog_id);
        prog_id = 0;
        std::cout<<"-----------------------------------------------"<<std::endl;
      }
    }

    // clear screen and set viewport
    glClearColor(0,0,0,0);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
    glfwGetFramebufferSize(window, &::width, &::height);
    glViewport(0,0,::width,::height);
    // select program 
    glUseProgram(prog_id);
    // Attach uniforms
    {
      if(is_animating)
      {
        double now = get_seconds();
        animation_seconds += now - last_time;
        last_time = now;
      }
      glUniform1f(glGetUniformLocation(prog_id,"animation_seconds"),animation_seconds);
    }
    glUniformMatrix4fv(
      glGetUniformLocation(prog_id,"proj"),1,false,proj.data());
    glUniformMatrix4fv(
      glGetUniformLocation(prog_id,"view"),1,false,view.matrix().data());
    // Draw mesh as wireframe
    if(wire_frame)
    {
      glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);
    }else
    {
      glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    }
    for(int i = 0;i<2;i++)
    {
      glUniform1i(glGetUniformLocation(prog_id, "is_moon"), i==1);
      glBindVertexArray(VAO);
      glDrawElements(GL_PATCHES, F.size(), GL_UNSIGNED_INT, 0);
      glBindVertexArray(0);
    }


    glfwSwapBuffers(window);

    // 60 fps
    {
      glfwPollEvents();
      // In microseconds
      double duration = 1000000.*(get_seconds()-tic);
      const double min_duration = 1000000./60.;
      if(duration<min_duration)
      {
        std::this_thread::sleep_for(std::chrono::microseconds((int)(min_duration-duration)));
      }
    }
  }

  // Graceful exit
  glfwDestroyWindow(window);
  glfwTerminate();
  return EXIT_SUCCESS;
}